

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O0

void __thiscall HEkkDualRow::chooseJoinpack(HEkkDualRow *this,HEkkDualRow *otherRow)

{
  int iVar1;
  pair<int,_double> *__first;
  double *pdVar2;
  long in_RSI;
  pair<int,_double> *in_RDI;
  pair<int,_double> *otherData;
  HighsInt otherCount;
  pair<int,_double> *__result;
  
  iVar1 = *(int *)(in_RSI + 0xc4);
  __first = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::data
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       0x79ede8);
  __result = __first + iVar1;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             &in_RDI[0xc].second,(long)*(int *)&in_RDI[0xc].field_0x4);
  std::copy<std::pair<int,double>const*,std::pair<int,double>*>(__first,in_RDI,__result);
  *(int *)&in_RDI[0xc].field_0x4 = *(int *)&in_RDI[0xc].field_0x4 + iVar1;
  pdVar2 = std::min<double>(&in_RDI[0xb].second,(double *)(in_RSI + 0xb8));
  in_RDI[0xb].second = *pdVar2;
  return;
}

Assistant:

void HEkkDualRow::chooseJoinpack(const HEkkDualRow* otherRow) {
  /**
   * Join pack of possible candidates in this row with possible
   * candidates in otherRow
   */
  const HighsInt otherCount = otherRow->workCount;
  const pair<HighsInt, double>* otherData = otherRow->workData.data();
  copy(otherData, otherData + otherCount, &workData[workCount]);
  workCount = workCount + otherCount;
  workTheta = min(workTheta, otherRow->workTheta);
}